

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O3

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
::construct_msgs(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
                 *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *param_1,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *param_2,int dist)

{
  _func_int **pp_Var1;
  pointer pmVar2;
  iterator iVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  pointer pTVar9;
  bool bVar10;
  uint uVar11;
  pointer puVar12;
  ostream *poVar13;
  ulong uVar14;
  pointer pmVar15;
  uint uVar16;
  pointer puVar17;
  long lVar18;
  pointer pmVar19;
  bool bVar20;
  uint *puVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  TwoBSA<unsigned_int> *pTVar25;
  long lVar26;
  int iVar27;
  size_t sVar28;
  ulong uVar29;
  MPI_Datatype poVar30;
  size_t prefix;
  MPI_Datatype local_1f0;
  uint local_1e4;
  int overlap_type;
  undefined4 local_1dc;
  TwoBSA<unsigned_int> *local_1d8;
  iterator iStack_1d0;
  TwoBSA<unsigned_int> *local_1c8;
  vector<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_> msgs;
  int my_schedule;
  comm *local_198;
  custom_op<unsigned_long,_true> op;
  int left_p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> active_elements;
  size_t local_128;
  ulong local_120;
  vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> local_118;
  vector<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_> out_of_bounds_msgs;
  size_t unresolved_els;
  unsigned_long result;
  int result_2;
  vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  ulong local_80;
  size_t rebucket_offset;
  size_t bucket_offset;
  size_t unfinished_b;
  vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> border_bucket;
  vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
  minqueries;
  
  local_120 = (ulong)(uint)dist;
  local_198 = &this->comm;
  local_88 = param_2;
  local_1e4 = mxx::left_shift<unsigned_int>
                        ((param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start,local_198);
  prefix = (size_t)(this->part).prefix;
  active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar12 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_1f0 = (MPI_Datatype)param_1;
  if (puVar17 != puVar12) {
    uVar14 = 0;
    do {
      uVar11 = puVar12[uVar14];
      uVar29 = uVar14 + 1;
      if (((prefix + uVar29 != (ulong)uVar11) ||
          ((uVar23 = this->local_size - 1, uVar14 < uVar23 && (uVar11 == puVar12[uVar14 + 1])))) ||
         ((uVar14 == uVar23 && ((uVar11 == local_1e4 && ((this->comm).m_rank < this->p + -1)))))) {
        op._vptr_custom_op = (_func_int **)CONCAT44(op._vptr_custom_op._4_4_,(uint)uVar14);
        if (active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&active_elements,
                     (iterator)
                     active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(uint *)&op);
          puVar12 = *(pointer *)local_1f0;
        }
        else {
          *active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = (uint)uVar14;
          active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        puVar17 = *(pointer *)(local_1f0 + 8);
      }
      uVar14 = uVar29;
    } while (uVar29 < (ulong)((long)puVar17 - (long)puVar12 >> 2));
  }
  pp_Var1 = (_func_int **)((long)&op.m_user_func.super__Function_base._M_functor + 8);
  op._vptr_custom_op = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&op,"get active elements","");
  if (op._vptr_custom_op != pp_Var1) {
    operator_delete(op._vptr_custom_op);
  }
  if ((this->comm).m_rank < this->p + -1) {
    local_1dc = (undefined4)
                CONCAT71((int7)((ulong)*(pointer *)(local_1f0 + 8) >> 8),
                         (*(pointer *)(local_1f0 + 8))[-1] == local_1e4);
  }
  else {
    local_1dc = 0;
  }
  if ((ulong)(uint)dist < this->n) {
    do {
      puVar12 = active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      out_of_bounds_msgs.
      super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      out_of_bounds_msgs.
      super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      out_of_bounds_msgs.
      super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      unresolved_els = 0;
      unfinished_b = 0;
      for (puVar17 = active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar12;
          puVar17 = puVar17 + 1) {
        uVar14 = (ulong)*puVar17;
        lVar26 = prefix + uVar14;
        uVar11 = (this->local_SA).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar14] + (int)local_120;
        if ((ulong)uVar11 < this->n) {
          op._vptr_custom_op = (_func_int **)CONCAT44((int)lVar26,uVar11);
          if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>::
            _M_realloc_insert<mypair<unsigned_int>>
                      ((vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>> *)&msgs,
                       (iterator)
                       msgs.
                       super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(mypair<unsigned_int> *)&op);
          }
          else {
            *msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish = (mypair<unsigned_int>)op._vptr_custom_op;
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 msgs.
                 super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          op._vptr_custom_op = (_func_int **)(lVar26 << 0x20);
          if (out_of_bounds_msgs.
              super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              out_of_bounds_msgs.
              super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>::
            _M_realloc_insert<mypair<unsigned_int>>
                      ((vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>> *)
                       &out_of_bounds_msgs,
                       (iterator)
                       out_of_bounds_msgs.
                       super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(mypair<unsigned_int> *)&op);
          }
          else {
            *out_of_bounds_msgs.
             super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish = (mypair<unsigned_int>)op._vptr_custom_op;
            out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_finish =
                 out_of_bounds_msgs.
                 super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        unresolved_els = unresolved_els + 1;
        if (lVar26 + 1U == (ulong)*(uint *)(*(long *)local_1f0 + uVar14 * 4)) {
          unfinished_b = unfinished_b + 1;
        }
      }
      mxx::custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
                ((custom_op<unsigned_long,true> *)&op);
      MPI_Allreduce(&unresolved_els,&result,1,op.m_type_copy,op.m_op,(this->comm).mpi_comm);
      poVar30 = local_1f0;
      lVar26 = CONCAT44(result._4_4_,(uint)result);
      mxx::custom_op<unsigned_long,_true>::~custom_op(&op);
      mxx::custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
                ((custom_op<unsigned_long,true> *)&op);
      MPI_Allreduce(&unfinished_b,&result,1,op.m_type_copy,op.m_op,(this->comm).mpi_comm);
      mxx::custom_op<unsigned_long,_true>::~custom_op(&op);
      if ((this->comm).m_rank == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"==== chaising iteration ",0x18);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," unresolved = ",0xe);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"==== chaising iteration ",0x18);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," unfinished = ",0xe);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
      }
      if (lVar26 != 0) {
        mxx::
        all2all_func<mypair<unsigned_int>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&)_1_>
                  (&msgs,(anon_class_8_1_8991fb9c)this,local_198);
        if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          puVar12 = (local_88->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pmVar15 = msgs.
                    super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pmVar15->first = puVar12[pmVar15->first - prefix];
            pmVar15 = pmVar15 + 1;
          } while (pmVar15 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        mxx::
        all2all_func<mypair<unsigned_int>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&)_2_>
                  (&msgs,(anon_class_8_1_8991fb9c)this,local_198);
        if (out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_finish !=
            out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
          std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<mypair<unsigned_int>*,std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>>>
                    ((vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>> *)&msgs,
                     msgs.
                     super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        pmVar19 = msgs.
                  super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pmVar15 = msgs.
                  super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_finish !=
            out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
          out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish =
               out_of_bounds_msgs.
               super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        uVar14 = (long)msgs.
                       super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)msgs.
                       super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        if (uVar14 != unresolved_els) {
          __assert_fail("msgs.size() == unresolved_els",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                        ,0x5be,
                        "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                       );
        }
        if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          lVar18 = 0x3f;
          if (uVar14 != 0) {
            for (; uVar14 >> lVar18 == 0; lVar18 = lVar18 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<mypair<unsigned_int>*,std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&,mypair<unsigned_int>const&)_1_>>
                    (msgs.
                     super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     msgs.
                     super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<mypair<unsigned_int>*,std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&,mypair<unsigned_int>const&)_1_>>
                    (pmVar15,pmVar19);
        }
        local_1d8 = (TwoBSA<unsigned_int> *)0x0;
        iStack_1d0._M_current = (TwoBSA<unsigned_int> *)0x0;
        local_1c8 = (TwoBSA<unsigned_int> *)0x0;
        local_118.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (TwoBSA<unsigned_int> *)0x0;
        local_118.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (TwoBSA<unsigned_int> *)0x0;
        local_118.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (TwoBSA<unsigned_int> *)0x0;
        local_a8.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (TwoBSA<unsigned_int> *)0x0;
        local_a8.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (TwoBSA<unsigned_int> *)0x0;
        local_a8.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (TwoBSA<unsigned_int> *)0x0;
        minqueries.
        super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        minqueries.
        super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        minqueries.
        super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        overlap_type = 0;
        local_80 = (ulong)**(uint **)poVar30;
        local_128 = 0;
        if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_128 = 0;
          pmVar15 = msgs.
                    super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            uVar11 = *(uint *)(*(long *)poVar30 + (pmVar15->second - prefix) * 4);
            uVar14 = (ulong)(uVar11 - 1);
            if ((uVar11 - 1 != pmVar15->second) && (prefix <= uVar14)) {
              __assert_fail("bucket_begin < prefix || bucket_begin == msgit->second",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                            ,0x5dc,
                            "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                           );
            }
            pmVar19 = msgs.
                      super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pmVar15 !=
                msgs.
                super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              uVar29 = (ulong)pmVar15->second;
              lVar18 = uVar29 - prefix;
              if (*(uint *)(*(long *)local_1f0 + lVar18 * 4) == uVar11) {
                puVar21 = (uint *)(*(long *)local_1f0 + lVar18 * 4);
                pmVar2 = pmVar15;
                do {
                  pmVar15 = pmVar2 + 1;
                  if ((uVar29 < prefix) || (prefix + this->local_size <= uVar29)) {
                    __assert_fail("msgit->second >= prefix && msgit->second < prefix+local_size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                                  ,0x5e1,
                                  "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                                 );
                  }
                  uVar16 = (this->local_SA).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar18];
                  op.m_user_func.super__Function_base._M_functor._0_4_ = uVar16;
                  op._vptr_custom_op = (_func_int **)CONCAT44(pmVar2->first,*puVar21);
                  if (iStack_1d0._M_current == local_1c8) {
                    std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>::
                    _M_realloc_insert<TwoBSA<unsigned_int>const&>
                              ((vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>> *)
                               &local_1d8,iStack_1d0,(TwoBSA<unsigned_int> *)&op);
                  }
                  else {
                    (iStack_1d0._M_current)->SA = uVar16;
                    *(_func_int ***)iStack_1d0._M_current = op._vptr_custom_op;
                    iStack_1d0._M_current = iStack_1d0._M_current + 1;
                  }
                  pmVar19 = pmVar15;
                  if (pmVar15 ==
                      msgs.
                      super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) break;
                  uVar29 = (ulong)pmVar2[1].second;
                  lVar18 = uVar29 - prefix;
                  puVar21 = (uint *)(*(long *)local_1f0 + lVar18 * 4);
                  pmVar19 = msgs.
                            super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  pmVar2 = pmVar15;
                } while (*puVar21 == uVar11);
              }
            }
            pTVar9 = local_a8.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pTVar8 = local_a8.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pTVar7 = local_a8.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pTVar6 = local_118.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pTVar5 = local_118.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pTVar4 = local_118.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar3._M_current = iStack_1d0._M_current;
            pTVar25 = local_1d8;
            if ((pmVar15 == pmVar19 & (byte)local_1dc) == 1) {
              if ((this->p + -1 <= (this->comm).m_rank) ||
                 ((*(pointer *)(local_1f0 + 8))[-1] != local_1e4)) {
                __assert_fail("comm.rank() < p-1 && local_B.back() == right_B",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x5eb,
                              "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                             );
              }
              if (uVar14 < prefix) {
                local_118.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = local_1c8;
                local_118.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start = local_1d8;
                local_118.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = iStack_1d0._M_current;
                local_1d8 = pTVar4;
                iStack_1d0._M_current = pTVar5;
                local_1c8 = pTVar6;
                overlap_type = 4;
              }
              else {
                overlap_type = overlap_type + 2;
                local_a8.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = local_1c8;
                local_a8.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start = local_1d8;
                local_a8.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = iStack_1d0._M_current;
                local_1d8 = pTVar7;
                iStack_1d0._M_current = pTVar8;
                local_1c8 = pTVar9;
                local_128 = uVar14 - prefix;
              }
            }
            else if (uVar14 < prefix) {
              overlap_type = overlap_type + 1;
              local_118.
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = local_1c8;
              local_118.
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start = local_1d8;
              local_118.
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = iStack_1d0._M_current;
              local_1d8 = pTVar4;
              iStack_1d0._M_current = pTVar5;
              local_1c8 = pTVar6;
            }
            else {
              if (local_1d8 != iStack_1d0._M_current) {
                uVar29 = ((long)iStack_1d0._M_current - (long)local_1d8 >> 2) * -0x5555555555555555;
                lVar18 = 0x3f;
                if (uVar29 != 0) {
                  for (; uVar29 >> lVar18 == 0; lVar18 = lVar18 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_1d8,iStack_1d0._M_current,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (pTVar25,iVar3._M_current);
              }
              sVar28 = uVar14 - prefix;
              if ((sVar28 != 0) && (uVar11 <= *(uint *)(*(long *)local_1f0 + -4 + sVar28 * 4))) {
                __assert_fail("out_idx == 0 || local_B[out_idx-1] < cur_b",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x603,
                              "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                             );
              }
              if (local_1d8 != iStack_1d0._M_current) {
                puVar12 = (this->local_SA).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar18 = *(long *)local_1f0;
                lVar24 = 0;
                pTVar25 = local_1d8;
                uVar16 = uVar11;
                do {
                  if ((lVar24 != 0) &&
                     (*(int *)((long)local_1d8 + lVar24 + -8) !=
                      *(int *)((long)&local_1d8->B2 + lVar24))) {
                    uVar16 = uVar11;
                  }
                  puVar12[sVar28] = pTVar25->SA;
                  *(uint *)(lVar18 + sVar28 * 4) = uVar16;
                  sVar28 = sVar28 + 1;
                  pTVar25 = pTVar25 + 1;
                  uVar11 = uVar11 + 1;
                  lVar24 = lVar24 + 0xc;
                } while (pTVar25 != iStack_1d0._M_current);
              }
              if ((sVar28 != this->local_size) &&
                 (prefix + sVar28 + 1 != (ulong)*(uint *)(*(long *)local_1f0 + sVar28 * 4))) {
                __assert_fail("out_idx == local_size || local_B[out_idx] == prefix+out_idx+1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x620,
                              "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                             );
              }
            }
            if (iStack_1d0._M_current != local_1d8) {
              iStack_1d0._M_current = local_1d8;
            }
            poVar30 = local_1f0;
          } while (pmVar15 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        my_schedule = -1;
        if ((this->comm).m_rank == 0) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&op,(long)this->p,
                     (allocator_type *)&result);
          iVar27 = (int)local_80;
          MPI_Gather(&overlap_type,1,&ompi_mpi_int,op._vptr_custom_op,1,&ompi_mpi_int,0,
                     (this->comm).mpi_comm);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&result,(long)this->p,
                     (allocator_type *)&border_bucket);
          if (0 < this->p) {
            lVar24 = 0;
            lVar18 = CONCAT44(result._4_4_,(uint)result);
            iVar22 = 0;
            do {
              switch(*(undefined4 *)((long)op._vptr_custom_op + lVar24 * 4)) {
              case 0:
                *(undefined4 *)(lVar18 + lVar24 * 4) = 0xffffffff;
                break;
              case 1:
              case 4:
                *(int *)(lVar18 + lVar24 * 4) = iVar22;
                break;
              case 2:
                *(undefined4 *)(lVar18 + lVar24 * 4) = 0;
                iVar22 = 0;
                break;
              case 3:
                *(int *)(lVar18 + lVar24 * 4) = iVar22;
                iVar22 = 1 - iVar22;
                break;
              default:
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x64d,
                              "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                             );
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 < this->p);
          }
          MPI_Scatter(CONCAT44(result._4_4_,(uint)result),1,&ompi_mpi_int,&my_schedule,1,
                      &ompi_mpi_int,0,(this->comm).mpi_comm);
          if ((void *)CONCAT44(result._4_4_,(uint)result) != (void *)0x0) {
            operator_delete((void *)CONCAT44(result._4_4_,(uint)result));
          }
          if (op._vptr_custom_op != (_func_int **)0x0) {
            operator_delete(op._vptr_custom_op);
          }
        }
        else {
          MPI_Gather(&overlap_type,1,&ompi_mpi_int,0,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
          iVar27 = (int)local_80;
          MPI_Scatter(0,1,&ompi_mpi_int,&my_schedule,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
        }
        uVar11 = iVar27 - 1;
        iVar27 = 0;
        bVar10 = true;
        do {
          bVar20 = bVar10;
          std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::vector
                    (&border_bucket,&local_118);
          uVar16 = (this->part).div1mod;
          if (uVar11 < uVar16) {
            left_p = uVar11 / ((this->part).div + 1);
          }
          else {
            left_p = (uVar11 - uVar16) / (this->part).div + (this->part).mod;
          }
          bucket_offset = 0;
          rebucket_offset = (ulong)uVar11;
          if (my_schedule == iVar27 || overlap_type != 3) {
            if (overlap_type == 2 && my_schedule == iVar27) goto LAB_00140c32;
            bVar10 = overlap_type != 0 && my_schedule == iVar27;
          }
          else {
LAB_00140c32:
            std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::operator=
                      (&border_bucket,&local_a8);
            left_p = (this->comm).m_rank;
            bucket_offset = local_128;
            bVar10 = true;
            rebucket_offset = prefix + local_128;
          }
          op._vptr_custom_op = (_func_int **)&left_p;
          op.m_user_func.super__Function_base._M_functor._M_unused._M_object = &border_bucket;
          op.m_user_func.super__Function_base._M_manager = (_Manager_type)&rebucket_offset;
          op.m_user_func._M_invoker = (_Invoker_type)&minqueries;
          op._40_8_ = &bucket_offset;
          op.m_user_func.super__Function_base._M_functor._8_8_ = this;
          op.m_type_copy = poVar30;
          op.m_op = (MPI_Op)&prefix;
          result._0_4_ = (uint)bVar10;
          MPI_Allreduce(&result,&result_2,1,&ompi_mpi_int,&ompi_mpi_op_land,(this->comm).mpi_comm);
          if (result_2 == 0) {
            mxx::comm::split((comm *)&result,local_198,(uint)bVar10);
            if (bVar10 != false) {
              construct_msgs::anon_class_64_8_0d7252e9::operator()
                        ((anon_class_64_8_0d7252e9 *)&op,(comm *)&result);
            }
            mxx::comm::~comm((comm *)&result);
          }
          else {
            construct_msgs::anon_class_64_8_0d7252e9::operator()
                      ((anon_class_64_8_0d7252e9 *)&op,local_198);
          }
          MPI_Barrier((this->comm).mpi_comm);
          if (border_bucket.
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(border_bucket.
                            super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          iVar27 = 1;
          bVar10 = false;
        } while (bVar20);
        local_1e4 = mxx::left_shift<unsigned_int>(*(uint **)poVar30,local_198);
        pp_Var1 = (_func_int **)((long)&op.m_user_func.super__Function_base._M_functor + 8);
        if ((this->comm).m_rank < this->p + -1) {
          local_1dc = (undefined4)
                      CONCAT71((int7)((ulong)*(pointer *)(poVar30 + 8) >> 8),
                               (*(pointer *)(poVar30 + 8))[-1] == local_1e4);
        }
        else {
          local_1dc = 0;
        }
        if (active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        pmVar15 = msgs.
                  super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pmVar19 = msgs.
                  super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          do {
            uVar16 = pmVar19->second - (int)prefix;
            uVar14 = (ulong)uVar16;
            op._vptr_custom_op = (_func_int **)CONCAT44(op._vptr_custom_op._4_4_,uVar16);
            uVar11 = *(uint *)(*(long *)poVar30 + uVar14 * 4);
            if (((uVar11 != pmVar19->second + 1) ||
                ((uVar29 = this->local_size - 1, uVar14 < uVar29 &&
                 (*(uint *)(*(long *)poVar30 + (ulong)(uVar16 + 1) * 4) == uVar11)))) ||
               ((uVar29 == uVar14 && ((local_1e4 == uVar11 && ((this->comm).m_rank < this->p + -1)))
                ))) {
              if (active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&active_elements,
                           (iterator)
                           active_elements.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(uint *)&op);
                pmVar15 = msgs.
                          super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                *active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish = uVar16;
                active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            pmVar19 = pmVar19 + 1;
          } while (pmVar19 != pmVar15);
          if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start != pmVar15) {
            puVar12 = (this->local_SA).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar18 = *(long *)poVar30;
            pmVar19 = msgs.
                      super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              lVar24 = pmVar19->second - prefix;
              pmVar19->first = puVar12[lVar24];
              pmVar19->second = *(uint *)(lVar18 + lVar24 * 4);
              pmVar19 = pmVar19 + 1;
            } while (pmVar19 != pmVar15);
          }
        }
        mxx::
        all2all_func<mypair<unsigned_int>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&)_3_>
                  (&msgs,(anon_class_8_1_8991fb9c)this,local_198);
        if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          puVar12 = (local_88->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pmVar15 = msgs.
                    super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            puVar12[pmVar15->first - prefix] = pmVar15->second;
            pmVar15 = pmVar15 + 1;
          } while (pmVar15 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        op._vptr_custom_op = pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&op,"bucket-chaising iteration","");
        if (op._vptr_custom_op != pp_Var1) {
          operator_delete(op._vptr_custom_op);
        }
        if (minqueries.
            super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(minqueries.
                          super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_a8.
            super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_start != (TwoBSA<unsigned_int> *)0x0) {
          operator_delete(local_a8.
                          super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_118.
            super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_start != (TwoBSA<unsigned_int> *)0x0) {
          operator_delete(local_118.
                          super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1d8 != (TwoBSA<unsigned_int> *)0x0) {
          operator_delete(local_1d8);
        }
      }
      if (out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(out_of_bounds_msgs.
                        super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(msgs.
                        super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    } while ((lVar26 != 0) && (local_120 = (ulong)(uint)((int)local_120 * 2), local_120 < this->n));
  }
  if (active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void construct_msgs(std::vector<index_t>& local_B, std::vector<index_t>& local_ISA, int dist)
{
    /*
     * Algorithm for few remaining buckets (more communication overhead per
     * element but sends only unfinished buckets -> less data in total if few
     * buckets remaining)
     *
     * INPUT:
     *  - SA in SA order
     *  - B in SA order
     *  - ISA in ISA order (<=> B in ISA order)
     *  - dist: the current dist=2^k, gets doubled after every iteration
     *
     * ALGO:
     * 1.) on i:            send tuple (`to:` Sa[i]+2^k, `from:` i)
     * 2.) on SA[i]+2^k:    return tuple (`to:` i, ISA[SA[i]+2^k])
     * 3.) on i:            for each unfinished bucket:
     *                          sort by new bucket index (2-stage across
     *                          processor boundaries using MPI subcommunicators)
     *                          rebucket into `B`
     * 4.) on i:            send tuple (`to:` SA[i], B[i]) // update bucket numbers in ISA order
     * 5.) on SA[i]:        update ISA[SA[i]] to new B[i]
     *
     */

    SAC_TIMER_START();


    /*
     * 0.) Preparation: need unfinished buckets (info accross proc. boundaries)
     */
    // get next element from right
    index_t right_B = mxx::left_shift(local_B[0], comm);

    // get global offset
    const std::size_t prefix = part.excl_prefix_size();

    // get active elements
    std::vector<index_t> active_elements;
    for (std::size_t j = 0; j < local_B.size(); ++j) {
        // get global index for each local index
        std::size_t i =  prefix + j;
        // check if this is a unresolved bucket
        // relying on the property that for resolved buckets:
        //   B[i] == i+1 and B[i+1] == i+2
        //   (where `i' is the global index)
        if (local_B[j] != i+1 || (local_B[j] == i+1
                    && ((j < local_size-1 && local_B[j+1] == i+1)
                        || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
        {
            // save local active indexes
            active_elements.push_back(j);
        }
    }
    SAC_TIMER_END_SECTION("get active elements");

    bool right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

    for (index_t shift_by = dist; shift_by < n; shift_by <<= 1) {
        /*
         * 1.) on i: send tuple (`to:` Sa[i]+2^k, `from:` i)
         */
        //std::vector<std::pair<index_t, index_t> > msgs;
        //std::vector<std::pair<index_t, index_t> > out_of_bounds_msgs;
        std::vector<mypair<index_t> > msgs;
        std::vector<mypair<index_t> > out_of_bounds_msgs;
        // linear scan for bucket boundaries
        // and create tuples/pairs
        std::size_t unresolved_els = 0;
        std::size_t unfinished_b = 0;
        for (index_t j : active_elements) {
            // get global index for each local index
            std::size_t i =  prefix + j;
            // add tuple
            if (local_SA[j] + shift_by >= n)
                //out_of_bounds_msgs.push_back(std::make_pair<index_t,index_t>(0, static_cast<index_t>(i)));
                out_of_bounds_msgs.push_back({0, static_cast<index_t>(i)});
            else
                //msgs.push_back(std::make_pair<index_t,index_t>(local_SA[j]+shift_by, static_cast<index_t>(i)));
                msgs.push_back({local_SA[j]+shift_by, static_cast<index_t>(i)});
            unresolved_els++;
            if (local_B[j] == i+1) // if first element of unfinished bucket:
                unfinished_b++;
        }

        // check if all resolved
        std::size_t gl_unresolved = mxx::allreduce(unresolved_els, comm);
        std::size_t gl_unfinished = mxx::allreduce(unfinished_b, comm);
        if (comm.rank() == 0) {
            INFO("==== chaising iteration " << shift_by << " unresolved = " << gl_unresolved);
            INFO("==== chaising iteration " << shift_by << " unfinished = " << gl_unfinished);
        }
        if (gl_unresolved == 0)
            // finished!
            break;

        // message exchange to processor which contains first index
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.first);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // for each message, add the bucket no. into the `first` field
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_ISA[it->first - prefix];
        }


        /*
         * 2.)
         */
        // send messages back to originator
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.second);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.second);}, comm);

        // append the previous out-of-bounds messages (since they all have B2 = 0)
        if (out_of_bounds_msgs.size() > 0)
            msgs.insert(msgs.end(), out_of_bounds_msgs.begin(), out_of_bounds_msgs.end());
        out_of_bounds_msgs.clear();

        assert(msgs.size() == unresolved_els);

        // sort received messages by the target index to enable consecutive
        // scanning of local buckets and messages
        std::sort(msgs.begin(), msgs.end(), [](const mypair<index_t>& x, const mypair<index_t>& y){ return x.second < y.second;});

        /*
         * 3.)
         */
        // building sequence of triplets for each unfinished bucket and sort
        // then rebucket, buckets which spread accross boundaries, sort via
        // MPI sub communicators and samplesort in two phases
        std::vector<TwoBSA<index_t> > bucket;
        std::vector<TwoBSA<index_t> > left_bucket;
        std::vector<TwoBSA<index_t> > right_bucket;

        // prepare LCP queries vector
        std::vector<std::tuple<index_t, index_t, index_t> > minqueries;

        // find bucket boundaries:
        auto msgit = msgs.begin();
        // overlap type:    0: no overlaps, 1: left overlap, 2:right overlap,
        //                  3: separate overlaps on left and right
        //                  4: contiguous overlap with both sides
        int overlap_type = 0; // init to no overlaps
        std::size_t bucket_begin = local_B[0]-1;
        std::size_t first_bucket_begin = bucket_begin;
        std::size_t right_bucket_offset = 0;
        while (msgit != msgs.end()) {
            bucket_begin = local_B[msgit->second - prefix]-1;
            assert(bucket_begin < prefix || bucket_begin == msgit->second);

            // find end of bucket
            while (msgit != msgs.end() && local_B[msgit->second - prefix]-1 == bucket_begin) {
                TwoBSA<index_t> tuple;
                assert(msgit->second >= prefix && msgit->second < prefix+local_size);
                tuple.SA = local_SA[msgit->second - prefix];
                tuple.B1 = local_B[msgit->second - prefix];
                tuple.B2 = msgit->first;
                bucket.push_back(tuple);
                msgit++;
            }

            // get bucket end (could be on other processor)
            if (msgit == msgs.end() && right_bucket_crosses_proc) {
                assert(comm.rank() < p-1 && local_B.back() == right_B);
                if (bucket_begin >= prefix)
                {
                    overlap_type += 2;
                    right_bucket.swap(bucket);
                    right_bucket_offset = bucket_begin - prefix;
                }
                else
                {
                    // bucket extends to left AND right
                    left_bucket.swap(bucket);
                    overlap_type = 4;
                }
            } else {
                if (bucket_begin >= prefix)
                {
                    // this is a local bucket => sort by B2, rebucket, and save
                    // TODO custom comparison that only sorts by B2, not by B1 as well
                    std::sort(bucket.begin(), bucket.end());
                    // local rebucket
                    // save back into local_B, local_SA, etc
                    index_t cur_b = bucket_begin + 1;
                    std::size_t out_idx = bucket_begin - prefix;
                    // assert previous bucket index is smaller
                    assert(out_idx == 0 || local_B[out_idx-1] < cur_b);
                    for (auto it = bucket.begin(); it != bucket.end(); ++it)
                    {
                        // if this is a new bucket, then update number
                        if (it != bucket.begin() && (it-1)->B2 != it->B2)
                        {
                            // update bucket index
                            cur_b = out_idx + prefix + 1;

                            if (_CONSTRUCT_LCP)
                            {
                                // add as query item for LCP construction
                                index_t left_b  = std::min((it-1)->B2, it->B2);
                                index_t right_b = std::max((it-1)->B2, it->B2);
                                // we need the minumum LCP of all suffixes in buckets between
                                // these two buckets. Since the first element in the left bucket
                                // is the LCP of this bucket with its left bucket and we don't need
                                // this LCP value, start one to the right:
                                // (-1 each since buffer numbers are current index + 1)
                                index_t range_left = (left_b-1) + 1;
                                index_t range_right = (right_b-1) + 1; // +1 since exclusive index
                                minqueries.emplace_back(out_idx + prefix, range_left, range_right);
                            }
                        }
                        local_SA[out_idx] = it->SA;
                        local_B[out_idx] = cur_b;
                        out_idx++;
                    }
                    // assert next bucket index is larger
                    assert(out_idx == local_size || local_B[out_idx] == prefix+out_idx+1);
                }
                else
                {
                    overlap_type += 1;
                    left_bucket.swap(bucket);
                }
            }
            bucket.clear();
        }

        // if we have left/right/both/or double buckets, do global comm in two phases
        int my_schedule = -1;
        if (comm.rank() == 0) {
            // gather all types to first processor
            std::vector<int> overlaps(p);
            MPI_Gather(&overlap_type, 1, MPI_INT, &overlaps[0], 1, MPI_INT, 0, comm);

            // create schedule using linear scan over the overlap types
            std::vector<int> schedule(p);
            int phase = 0; // start in first phase
            for (int i = 0; i < p; ++i) {
                switch (overlaps[i]) {
                    case 0:
                        schedule[i] = -1; // doesn't matter
                        break;
                    case 1:
                        // only left overlap -> participate in current phase
                        schedule[i] = phase;
                        break;
                    case 2:
                        // only right overlap, start with phase 0
                        phase = 0;
                        schedule[i] = phase;
                        break;
                    case 3:
                        // separate overlaps left and right -> switch phase
                        schedule[i] = phase; // left overlap starts with current phase
                        phase = 1 - phase;
                        break;
                    case 4:
                        // overlap with both: left and right => keep phase
                        schedule[i] = phase;
                        break;
                    default:
                        assert(false);
                        break;
                }
            }

            // scatter the schedule to the processors
            MPI_Scatter(&schedule[0], 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        } else {
            // send out my overlap type
            MPI_Gather(&overlap_type, 1, MPI_INT, NULL, 1, MPI_INT, 0, comm);

            // ... let master processor solve the schedule

            // receive schedule:
            MPI_Scatter(NULL, 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        }


        // two phase sorting across boundaries using sub communicators
        for (int phase = 0; phase <= 1; ++phase) {
            std::vector<TwoBSA<index_t> > border_bucket = left_bucket;
            // the leftmost processor of a group will be used as split
            int left_p = part.target_processor(first_bucket_begin);
            bool participate = (overlap_type != 0 && my_schedule == phase);
            std::size_t bucket_offset = 0; // left bucket starts from beginning
            std::size_t rebucket_offset = first_bucket_begin;
            if ((my_schedule != phase && overlap_type == 3) || (my_schedule == phase && overlap_type == 2)) {
                // starting a bucket at the end
                border_bucket = right_bucket;
                left_p = comm.rank();
                participate = true;
                bucket_offset = right_bucket_offset;
                rebucket_offset = prefix + bucket_offset;
            }

            comm.with_subset(participate,[&](const mxx::comm& sc) {
                // split communicator to `left_p`
                mxx::comm subcomm = sc.split(left_p);

                // sample sort the bucket with arbitrary distribution
                mxx::sort(border_bucket.begin(), border_bucket.end(), subcomm);

#ifndef NDEBUG
                index_t first_bucket = border_bucket[0].B1;
#endif
                // rebucket with global offset of first -> in tuple form (also updates LCP)
                rebucket_tuples(border_bucket, subcomm, rebucket_offset, minqueries);
                // assert first bucket index remains the same
                assert(subcomm.rank() != 0 || first_bucket == border_bucket[0].B1);

                // save into full array (if this was left -> save to beginning)
                // (else, need offset of last)
                assert(bucket_offset == 0 || local_B[bucket_offset-1] < border_bucket[0].B1);
                assert(bucket_offset+border_bucket.size() <= local_size);
                for (std::size_t i = 0; i < border_bucket.size(); ++i) {
                    local_SA[i+bucket_offset] = border_bucket[i].SA;
                    local_B[i+bucket_offset] = border_bucket[i].B1;
                }
                assert(bucket_offset+border_bucket.size() == local_size || (local_B[bucket_offset+border_bucket.size()] > local_B[bucket_offset+border_bucket.size()-1]));
                assert(subcomm.rank() != 0 || local_B[bucket_offset] == bucket_offset+prefix+1);

                /*
                 * LCP update
                 */
                // LCP is updated in the custom `rebucket_tuples` function
            });

            comm.barrier();
        }


        // get new bucket number to the right
        right_B = mxx::left_shift(local_B[0], comm);
        // check if right bucket still goes over boundary
        right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

        // remember all the remaining active elements
        active_elements.clear();
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            index_t j = it->second - prefix;
            index_t i = it->second;
            // check if this is a unresolved bucket
            // relying on the property that for resolved buckets:
            //   B[i] == i+1 and B[i+1] == i+2
            //   (where `i' is the global index)
            if (local_B[j] != i+1 || (local_B[j] == i+1
                        && ((j < local_size-1 && local_B[j+1] == i+1)
                            || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
            {
                // save local active indexes
                active_elements.push_back(j);
            }
        }

        /*
         * 4.1)   Update LCP
         */
        if (_CONSTRUCT_LCP) {
            // time LCP separately!
            SAC_TIMER_START();
            // get parallel-distributed RMQ for all queries, results are in
            // `minqueries`
            // TODO: bulk updatable RMQs [such that we don't have to construct the
            //       RMQ for the local_LCP in each iteration]
            bulk_rmq(n, local_LCP, minqueries, comm);

            // update the new LCP values:
            for (auto min_lcp : minqueries) {
                local_LCP[std::get<0>(min_lcp) - prefix] = shift_by + std::get<2>(min_lcp);
            }
            SAC_TIMER_END_SECTION("LCP update");
        }

        /*
         * 4.2)  Update ISA
         */
        // message new bucket numbers to new SA[i] for all previously unfinished
        // buckets
        // since the message array is still available with the indices of unfinished
        // buckets -> reuse that information => no need to rescan the whole
        // local array
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_SA[it->second - prefix]; // SA[i]
            it->second = local_B[it->second - prefix]; // B[i]
        }

        // message exchange to processor which contains first index
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // update local ISA with new bucket numbers
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            local_ISA[it->first-prefix] = it->second;
        }
        SAC_TIMER_END_SECTION("bucket-chaising iteration");
    }
}